

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::VertexExpanderShader
          (VertexExpanderShader *this,ContextType *contextType,GeometryShaderInputType inputType,
          GeometryShaderOutputType outputType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderProgramDeclaration *pSVar2;
  ostream *poVar3;
  GeometryShaderInputType inputType_00;
  GeometryShaderOutputType outputType_00;
  ostringstream str;
  string local_498;
  long *local_478;
  long local_470;
  long local_468 [2];
  long *local_458;
  long local_450;
  long local_448 [2];
  string local_438;
  FragmentSource local_418;
  string local_3f8;
  VertexSource local_3d8;
  FragmentOutput local_3b4;
  VertexAttribute local_3b0;
  VertexAttribute local_388;
  string local_360;
  GeometrySource local_340;
  string local_320;
  string local_300;
  GeometryToFragmentVarying local_2e0;
  VertexToGeometryVarying local_2d8;
  GeometryShaderDeclaration local_2d0;
  ostringstream local_2b8 [112];
  ios_base local_248 [264];
  ShaderProgramDeclaration local_140;
  
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00b46590;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00b465c8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00b465e0;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"a_position","");
  local_388.name._M_dataplus._M_p = (pointer)&local_388.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,local_458,local_450 + (long)local_458);
  local_388.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_388);
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"a_color","");
  local_3b0.name._M_dataplus._M_p = (pointer)&local_3b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_478,local_470 + (long)local_478);
  local_3b0.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_3b0);
  local_2d8.type = GENERICVECTYPE_FLOAT;
  local_2d8.flatshade = false;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_2d8);
  local_2e0.type = GENERICVECTYPE_FLOAT;
  local_2e0.flatshade = false;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_2e0);
  local_3b4.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_3b4);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,"");
  specializeShader(&local_300,&local_3f8,contextType);
  local_3d8.source._M_dataplus._M_p = (pointer)&local_3d8.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_3d8);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_438,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,"");
  specializeShader(&local_320,&local_438,contextType);
  local_418.source._M_dataplus._M_p = (pointer)&local_418.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_418);
  if (inputType < GEOMETRYSHADERINPUTTYPE_LAST) {
    local_2d0.numOutputVertices = *(size_t *)(&DAT_00963528 + (ulong)inputType * 8);
  }
  else {
    local_2d0.numOutputVertices = 0;
  }
  local_2d0.numInvocations = 1;
  local_2d0.inputType = inputType;
  local_2d0.outputType = outputType;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_2d0);
  std::__cxx11::ostringstream::ostringstream(local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2b8,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2b8,"${GLSL_EXT_GEOMETRY_SHADER}",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"layout(",7);
  (anonymous_namespace)::inputTypeToGLString_abi_cxx11_
            (&local_498,(_anonymous_namespace_ *)(ulong)inputType,inputType_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2b8,local_498._M_dataplus._M_p,local_498._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in;\n",6);
  paVar1 = &local_498.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"layout(",7);
  (anonymous_namespace)::outputTypeToGLString_abi_cxx11_
            (&local_498,(_anonymous_namespace_ *)(ulong)outputType,outputType_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2b8,local_498._M_dataplus._M_p,local_498._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", max_vertices = ",0x11);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") out;",6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2b8,
             "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n\tconst highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n\tconst highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n\t      highp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n\n\tfor (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n}\n"
             ,0x380);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_360,&local_498,contextType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_2b8);
  std::ios_base::~ios_base(local_248);
  paVar1 = &local_340.source.field_2;
  local_340.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_340);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_340.source._M_dataplus._M_p,
                    local_340.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.source._M_dataplus._M_p != &local_418.source.field_2) {
    operator_delete(local_418.source._M_dataplus._M_p,
                    local_418.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.source._M_dataplus._M_p != &local_3d8.source.field_2) {
    operator_delete(local_3d8.source._M_dataplus._M_p,
                    local_3d8.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != &local_3b0.name.field_2) {
    operator_delete(local_3b0.name._M_dataplus._M_p,local_3b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.name._M_dataplus._M_p != &local_388.name.field_2) {
    operator_delete(local_388.name._M_dataplus._M_p,local_388.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00b46590;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00b465c8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00b465e0;
  return;
}

Assistant:

VertexExpanderShader::VertexExpanderShader (const glu::ContextType& contextType, rr::GeometryShaderInputType inputType, rr::GeometryShaderOutputType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(specializeShader(s_commonShaderSourceVertex, contextType))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(inputType, outputType, calcOutputVertices(inputType))
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, inputType, outputType)))
{
}